

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O0

void __thiscall cppcms::impl::details::basic_map<$d0c7d56a$>::clear(basic_map<_d0c7d56a_> *this)

{
  ulong uVar1;
  container *pcVar2;
  size_type sVar3;
  iterator pcVar4;
  reference pvVar5;
  range_type *prVar6;
  basic_map<_d0c7d56a_> *in_RDI;
  range_type *r;
  iterator del_1;
  iterator del;
  size_t i;
  iterator p;
  iterator in_stack_ffffffffffffffb8;
  iterator p_00;
  basic_map<_d0c7d56a_> *in_stack_ffffffffffffffe0;
  iterator local_18;
  container *local_10;
  
  local_10 = (in_RDI->list_).begin;
  uVar1 = in_RDI->size_;
  sVar3 = std::vector<$8fa62532$>::size(&in_RDI->hash_);
  if (uVar1 >> 2 < sVar3) {
    while (local_10 != (container *)0x0) {
      pcVar2 = local_10->next;
      local_10->prev = (container *)0x0;
      local_10->next = (container *)0x0;
      prVar6 = basic_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,cppcms::impl::shmem_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>const,cppcms::impl::mem_cache<cppcms::impl::process_settings>::container>,cppcms::impl::process_settings::process_memory>>::iterator,cppcms::impl::shmem_allocator<cppcms::impl::hash_map<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>,cppcms::impl::mem_cache<cppcms::impl::process_s...r,cppcms::impl::process_settings::process_memory>>>,cppcms::impl::process_settings::process_memory>>
               ::
               get<std::__cxx11::basic_string<char,std::char_traits<char>,cppcms::impl::shmem_allocator<char,cppcms::impl::process_settings::process_memory>>>
                         (in_stack_ffffffffffffffe0,
                          (basic_string<char,_std::char_traits<char>,_cppcms::impl::shmem_allocator<char,_cppcms::impl::process_settings::process_memory>_>
                           *)local_10);
      prVar6->second = (container *)0x0;
      prVar6->first = (container *)0x0;
      destroy(in_RDI,in_stack_ffffffffffffffb8);
      local_10 = pcVar2;
    }
  }
  else {
    local_18 = (iterator)0x0;
    while (p_00 = local_18, pcVar4 = (iterator)std::vector<$8fa62532$>::size(&in_RDI->hash_),
          p_00 < pcVar4) {
      pvVar5 = std::vector<$8fa62532$>::operator[](&in_RDI->hash_,(size_type)local_18);
      pvVar5->first = (container *)0x0;
      pvVar5 = std::vector<$8fa62532$>::operator[](&in_RDI->hash_,(size_type)local_18);
      pvVar5->second = (container *)0x0;
      local_18 = (iterator)((long)&(local_18->val).first._M_dataplus._M_p + 1);
    }
    while (local_10 != (container *)0x0) {
      pcVar2 = local_10->next;
      local_10->prev = (container *)0x0;
      local_10->next = (container *)0x0;
      destroy(in_RDI,p_00);
      local_10 = pcVar2;
    }
  }
  (in_RDI->list_).end = (container *)0x0;
  (in_RDI->list_).begin = (container *)0x0;
  in_RDI->size_ = 0;
  return;
}

Assistant:

void clear()
	{
		iterator p=list_.begin;
		if(size_ / 4 >= hash_.size()) {
			for(size_t i=0;i<hash_.size();i++) {
				hash_[i].first = 0;
				hash_[i].second = 0;
			}
			while(p) {
				iterator del = p;
				p=p->next;
				del->prev = 0;
				del->next = 0;
				destroy(del);
			}
		}
		else {
			while(p) {
				iterator del = p;
				p=p->next;
				del->prev = 0;
				del->next = 0;
				range_type &r=get(del->val.first);
				r.first = r.second = 0;
				destroy(del);
			}
		}
		list_.begin = list_.end = 0;
		size_ = 0;
	}